

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImDrawListSplitter *pIVar1;
  undefined4 uVar2;
  double dVar3;
  ImGuiWindow *pIVar4;
  ImGuiTable *pIVar5;
  ImGuiTableTempData *pIVar6;
  ImGuiWindow *pIVar7;
  float *__src;
  ImGuiTableColumn *pIVar8;
  char *__src_00;
  ImGuiContext *pIVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  ImU32 IVar13;
  ImGuiTable *table;
  ImGuiTableTempData *__dest;
  ImRect *pIVar14;
  float *__dest_00;
  undefined8 *puVar15;
  char *__dest_01;
  uint uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  ImVec2 *pIVar21;
  undefined4 *puVar22;
  ImVec2 *pIVar23;
  ImGuiID id_00;
  long lVar24;
  ulong uVar25;
  int iVar26;
  ImGuiContext *g;
  size_t size;
  int iVar27;
  ImGuiTableColumn *pIVar28;
  byte bVar29;
  uint uVar30;
  undefined4 in_XMM0_Db;
  ImVec2 IVar31;
  float fVar32;
  undefined8 extraout_XMM0_Qb;
  ImVec2 IVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  ImRect outer_rect;
  void *local_110;
  ImRect local_e8;
  undefined8 local_d8;
  char *local_c0;
  ulong local_b8;
  ImVec2 *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImDrawListSplitter local_98;
  undefined3 uStack_80;
  undefined5 uStack_7d;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined3 uStack_70;
  undefined5 uStack_6d;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar9 = GImGui;
  bVar29 = 0;
  local_d8 = (ImGuiWindow *)CONCAT44(in_XMM0_Db,inner_width);
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems == false) {
    IVar31 = GetContentRegionAvail();
    fVar36 = IVar31.y;
    auVar35._8_4_ = (int)extraout_XMM0_Qb;
    auVar35._0_4_ = IVar31.x;
    auVar35._4_4_ = IVar31.y;
    auVar35._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    if (IVar31.x <= 1.0) {
      auVar35._0_4_ = 0x3f800000;
    }
    if ((flags & 0x3000000U) == 0) {
      IVar31 = CalcItemSize(*outer_size,auVar35._0_4_,0.0);
      local_e8.Min = (pIVar4->DC).CursorPos;
      local_e8.Max.x = IVar31.x + local_e8.Min.x;
      local_e8.Max.y = IVar31.y + local_e8.Min.y;
    }
    else {
      if (fVar36 <= 1.0) {
        fVar36 = 1.0;
      }
      IVar31 = CalcItemSize(*outer_size,auVar35._0_4_,fVar36);
      local_e8.Min = (pIVar4->DC).CursorPos;
      local_e8.Max.x = IVar31.x + local_e8.Min.x;
      local_e8.Max.y = IVar31.y + local_e8.Min.y;
      bVar10 = IsClippedEx(&local_e8,0);
      if (bVar10) {
        ItemSize(&local_e8,-1.0);
        goto LAB_0015126d;
      }
    }
    local_c0 = name;
    local_b0 = outer_size;
    table = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar9->Tables,id);
    local_b8 = 0;
    if (table->LastFrameActive == pIVar9->FrameCount) {
      local_b8 = (ulong)((int)table->InstanceCurrent + 1);
    }
    uVar16 = table->Flags;
    pIVar5 = (pIVar9->Tables).Buf.Data;
    iVar20 = pIVar9->TablesTempDataStacked;
    iVar19 = (int)((long)iVar20 + 1);
    pIVar9->TablesTempDataStacked = iVar19;
    if ((pIVar9->TablesTempData).Size <= iVar20) {
      uStack_a0 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0;
      uStack_6d = 0;
      local_98._Channels.Data = (ImDrawChannel *)0x0;
      uStack_80 = 0;
      uStack_7d = 0;
      local_98._Current = 0;
      local_98._Count = 0;
      local_98._Channels.Size = 0;
      local_98._Channels.Capacity = 0;
      local_a8.x = 0.0;
      local_a8.y = -1.0;
      iVar27 = (pIVar9->TablesTempData).Capacity;
      if (iVar27 <= iVar20) {
        if (iVar27 == 0) {
          iVar26 = 8;
        }
        else {
          iVar26 = iVar27 / 2 + iVar27;
        }
        if (iVar26 <= iVar19) {
          iVar26 = iVar19;
        }
        if (iVar27 < iVar26) {
          __dest = (ImGuiTableTempData *)MemAlloc((long)iVar26 * 0x70);
          pIVar6 = (pIVar9->TablesTempData).Data;
          if (pIVar6 != (ImGuiTableTempData *)0x0) {
            memcpy(__dest,pIVar6,(long)(pIVar9->TablesTempData).Size * 0x70);
            MemFree((pIVar9->TablesTempData).Data);
          }
          (pIVar9->TablesTempData).Data = __dest;
          (pIVar9->TablesTempData).Capacity = iVar26;
        }
      }
      iVar27 = (pIVar9->TablesTempData).Size;
      if (iVar27 <= iVar20) {
        lVar18 = ((long)iVar20 + 1) - (long)iVar27;
        lVar24 = (long)iVar27 * 0x70;
        do {
          pIVar21 = &local_a8;
          pIVar23 = (ImVec2 *)((long)&((pIVar9->TablesTempData).Data)->TableIndex + lVar24);
          for (lVar17 = 0xe; lVar17 != 0; lVar17 = lVar17 + -1) {
            *pIVar23 = *pIVar21;
            pIVar21 = pIVar21 + (ulong)bVar29 * -2 + 1;
            pIVar23 = pIVar23 + (ulong)bVar29 * -2 + 1;
          }
          lVar24 = lVar24 + 0x70;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      (pIVar9->TablesTempData).Size = iVar19;
      ImDrawListSplitter::ClearFreeMemory(&local_98);
      if (local_98._Channels.Data != (ImDrawChannel *)0x0) {
        MemFree(local_98._Channels.Data);
      }
    }
    iVar20 = (int)((long)table - (long)pIVar5 >> 3) * -0x3f03f03f;
    lVar18 = (long)pIVar9->TablesTempDataStacked;
    pIVar6 = (pIVar9->TablesTempData).Data;
    table->TempData = pIVar6 + lVar18 + -1;
    pIVar6[lVar18 + -1].TableIndex = iVar20;
    pIVar1 = &pIVar6[lVar18 + -1].DrawSplitter;
    table->DrawSplitter = pIVar1;
    pIVar1->_Current = 0;
    pIVar1->_Count = 1;
    bVar10 = (flags & 0xe000U) == 0;
    table->IsDefaultSizingPolicy = bVar10;
    uVar11 = flags;
    if (bVar10) {
      uVar11 = 0x2000;
      if ((((uint)flags >> 0x18 & 1) == 0) && (uVar11 = 0x2000, (pIVar4->Flags & 0x40) == 0)) {
        uVar11 = 0x8000;
      }
      uVar11 = uVar11 | flags;
    }
    uVar12 = uVar11 | 0x40000;
    if ((uVar11 & 0xe000) != 0x4000) {
      uVar12 = uVar11;
    }
    uVar11 = uVar12 & 0xfffcffff;
    if ((uVar12 & 0x3000000) == 0) {
      uVar11 = uVar12;
    }
    uVar30 = uVar11 & 0xfffff7ff;
    if ((uVar11 >> 0xc & 1) == 0) {
      uVar30 = uVar11;
    }
    uVar11 = (uVar12 & 1) << 9 | uVar30;
    uVar12 = uVar11 | 0x10;
    if ((uVar30 & 0xf) == 0) {
      uVar11 = uVar12;
    }
    id_00 = (int)local_b8 + id;
    if (((uint)pIVar4->RootWindow->Flags >> 8 & 1) != 0) {
      uVar11 = uVar12;
    }
    table->ID = id;
    table->Flags = uVar11;
    table->InstanceCurrent = (ImS16)local_b8;
    table->LastFrameActive = pIVar9->FrameCount;
    table->InnerWindow = pIVar4;
    table->OuterWindow = pIVar4;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = (float)local_d8;
    pIVar6[lVar18 + -1].UserOuterSize = *local_b0;
    if ((flags & 0x3000000U) == 0) {
      pIVar14 = &local_e8;
      (table->InnerRect).Min = local_e8.Min;
      (table->InnerRect).Max = local_e8.Max;
      (table->OuterRect).Min = local_e8.Min;
      (table->OuterRect).Max = local_e8.Max;
      lVar24 = 0x114;
    }
    else {
      fVar36 = (float)local_d8;
      if ((uVar11 & 0x1000000) == 0) {
        fVar36 = 3.4028235e+38;
      }
      fVar36 = (float)(~-(uint)(0.0 < (float)local_d8) & 0x7f7fffff |
                      (uint)fVar36 & -(uint)(0.0 < (float)local_d8));
      if (fVar36 != 3.4028235e+38 || (uVar11 & 0x3000000) == 0x1000000) {
        if ((uVar11 & 0x3000000) == 0x1000000) {
          local_a8.y = 1.1754944e-38;
        }
        else {
          local_a8.y = 0.0;
        }
        local_a8.x = (float)(-(uint)(fVar36 != 3.4028235e+38) & (uint)fVar36);
        SetNextWindowContentSize(&local_a8);
      }
      if ((uVar16 & 0x3000000) == 0) {
        local_a8.x = 0.0;
        local_a8.y = 0.0;
        SetNextWindowScroll(&local_a8);
      }
      local_a8.x = local_e8.Max.x - local_e8.Min.x;
      local_a8.y = local_e8.Max.y - local_e8.Min.y;
      BeginChildEx(local_c0,id_00,&local_a8,false,(uVar11 & 0x1000000) >> 0xd);
      pIVar7 = pIVar9->CurrentWindow;
      table->InnerWindow = pIVar7;
      IVar31 = (pIVar7->WorkRect).Max;
      (table->WorkRect).Min = (pIVar7->WorkRect).Min;
      (table->WorkRect).Max = IVar31;
      IVar31 = pIVar7->Pos;
      IVar33.x = (pIVar7->Size).x + IVar31.x;
      IVar33.y = (pIVar7->Size).y + IVar31.y;
      (table->OuterRect).Min = IVar31;
      (table->OuterRect).Max = IVar33;
      pIVar14 = &pIVar7->InnerRect;
      lVar24 = 0x104;
    }
    IVar31 = pIVar14->Max;
    pIVar21 = (ImVec2 *)((long)&table->ID + lVar24);
    *pIVar21 = pIVar14->Min;
    pIVar21[1] = IVar31;
    PushOverrideID(id_00);
    pIVar7 = table->InnerWindow;
    table->HostIndentX = (pIVar7->DC).Indent.x;
    IVar31 = (pIVar7->ClipRect).Max;
    (table->HostClipRect).Min = (pIVar7->ClipRect).Min;
    (table->HostClipRect).Max = IVar31;
    table->HostSkipItems = pIVar7->SkipItems;
    IVar31 = (pIVar7->WorkRect).Max;
    pIVar6[lVar18 + -1].HostBackupWorkRect.Min = (pIVar7->WorkRect).Min;
    pIVar6[lVar18 + -1].HostBackupWorkRect.Max = IVar31;
    IVar31 = (pIVar7->ParentWorkRect).Max;
    pIVar6[lVar18 + -1].HostBackupParentWorkRect.Min = (pIVar7->ParentWorkRect).Min;
    pIVar6[lVar18 + -1].HostBackupParentWorkRect.Max = IVar31;
    pIVar6[lVar18 + -1].HostBackupColumnsOffset.x = (pIVar4->DC).ColumnsOffset.x;
    pIVar6[lVar18 + -1].HostBackupPrevLineSize = (pIVar7->DC).PrevLineSize;
    pIVar6[lVar18 + -1].HostBackupCurrLineSize = (pIVar7->DC).CurrLineSize;
    pIVar6[lVar18 + -1].HostBackupCursorMaxPos = (pIVar7->DC).CursorMaxPos;
    pIVar6[lVar18 + -1].HostBackupItemWidth = (pIVar4->DC).ItemWidth;
    pIVar6[lVar18 + -1].HostBackupItemWidthStackSize = (pIVar4->DC).ItemWidthStack.Size;
    fVar36 = 0.0;
    fVar32 = 0.0;
    if ((uVar11 >> 9 & 1) != 0) {
      fVar32 = 1.0;
    }
    (pIVar7->DC).CurrLineSize.x = 0.0;
    (pIVar7->DC).CurrLineSize.y = 0.0;
    (pIVar7->DC).PrevLineSize.x = 0.0;
    (pIVar7->DC).PrevLineSize.y = 0.0;
    if ((uVar11 & 0x800200) == 0) {
      fVar36 = (pIVar9->Style).CellPadding.x;
    }
    fVar38 = 0.0;
    fVar37 = 0.0;
    if ((uVar11 & 0x800200) == 0x200) {
      fVar37 = (pIVar9->Style).CellPadding.x;
    }
    table->CellSpacingX1 = fVar32 + fVar36;
    table->CellSpacingX2 = fVar36;
    table->CellPaddingX = fVar37;
    table->CellPaddingY = (pIVar9->Style).CellPadding.y;
    fVar36 = 0.0;
    if ((uVar11 >> 10 & 1) != 0) {
      fVar36 = 1.0;
    }
    if ((uVar11 >> 0x16 & 1) == 0 && (uVar11 & 0x200400) != 0) {
      fVar38 = (pIVar9->Style).CellPadding.x;
    }
    table->OuterPaddingX = (fVar36 + fVar38) - fVar37;
    table->CurrentRow = -1;
    table->CurrentColumn = -1;
    table->RowBgColorCounter = 0;
    *(uint *)&table->field_0x98 = (uint)*(ushort *)&table->field_0x98;
    pIVar14 = &pIVar7->ClipRect;
    if (pIVar7 == pIVar4) {
      pIVar14 = &table->WorkRect;
    }
    IVar31 = pIVar14->Max;
    (table->InnerClipRect).Min = pIVar14->Min;
    (table->InnerClipRect).Max = IVar31;
    IVar31 = (table->InnerClipRect).Min;
    auVar34._8_8_ = 0;
    auVar34._0_4_ = (table->InnerClipRect).Max.x;
    auVar34._4_4_ = (table->InnerClipRect).Max.y;
    IVar33 = (table->WorkRect).Min;
    fVar37 = IVar33.x;
    fVar38 = IVar33.y;
    auVar39._8_8_ = 0;
    auVar39._0_4_ = (table->WorkRect).Max.x;
    auVar39._4_4_ = (table->WorkRect).Max.y;
    auVar35 = minps(auVar34,auVar39);
    fVar36 = IVar31.x;
    fVar32 = IVar31.y;
    uVar12 = -(uint)(fVar37 <= fVar36);
    uVar30 = -(uint)(fVar38 <= fVar32);
    (table->InnerClipRect).Min =
         (ImVec2)(CONCAT44(~uVar30 & (uint)fVar38,~uVar12 & (uint)fVar37) |
                 CONCAT44((uint)fVar32 & uVar30,(uint)fVar36 & uVar12));
    (table->InnerClipRect).Max = auVar35._0_8_;
    ImRect::ClipWithFull(&table->InnerClipRect,&table->HostClipRect);
    if ((uVar11 >> 0x11 & 1) == 0) {
      fVar36 = (pIVar7->ClipRect).Max.y;
    }
    else {
      fVar36 = (table->InnerClipRect).Max.y;
      fVar32 = (pIVar7->WorkRect).Max.y;
      if (fVar32 <= fVar36) {
        fVar36 = fVar32;
      }
    }
    (table->InnerClipRect).Max.y = fVar36;
    fVar36 = (table->WorkRect).Min.y;
    table->RowPosY2 = fVar36;
    table->RowPosY1 = fVar36;
    table->RowTextBaseline = 0.0;
    table->FreezeRowsRequest = '\0';
    table->FreezeRowsCount = '\0';
    table->FreezeColumnsRequest = '\0';
    table->FreezeColumnsCount = '\0';
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = '\0';
    IVar13 = GetColorU32(0x2b,1.0);
    table->BorderColorStrong = IVar13;
    IVar13 = GetColorU32(0x2c,1.0);
    table->BorderColorLight = IVar13;
    pIVar9->CurrentTable = table;
    (pIVar4->DC).CurrentTableIdx = iVar20;
    if (pIVar7 != pIVar4) {
      (pIVar7->DC).CurrentTableIdx = iVar20;
    }
    if (((uVar16 & 2) != 0) && ((uVar11 & 2) == 0)) {
      table->IsResetDisplayOrderRequest = true;
    }
    local_d8 = pIVar7;
    if ((pIVar9->TablesLastTimeActive).Size <= iVar20) {
      iVar27 = iVar20 + 1;
      iVar19 = (pIVar9->TablesLastTimeActive).Capacity;
      if (iVar19 <= iVar20) {
        if (iVar19 == 0) {
          iVar26 = 8;
        }
        else {
          iVar26 = iVar19 / 2 + iVar19;
        }
        if (iVar26 <= iVar27) {
          iVar26 = iVar27;
        }
        if (iVar19 < iVar26) {
          __dest_00 = (float *)MemAlloc((long)iVar26 << 2);
          __src = (pIVar9->TablesLastTimeActive).Data;
          if (__src != (float *)0x0) {
            memcpy(__dest_00,__src,(long)(pIVar9->TablesLastTimeActive).Size << 2);
            MemFree((pIVar9->TablesLastTimeActive).Data);
          }
          (pIVar9->TablesLastTimeActive).Data = __dest_00;
          (pIVar9->TablesLastTimeActive).Capacity = iVar26;
        }
      }
      iVar19 = (pIVar9->TablesLastTimeActive).Size;
      lVar24 = (long)iVar19;
      if (iVar19 <= iVar20) {
        do {
          (pIVar9->TablesLastTimeActive).Data[lVar24] = -1.0;
          lVar24 = lVar24 + 1;
        } while (iVar27 != lVar24);
      }
      (pIVar9->TablesLastTimeActive).Size = iVar27;
    }
    dVar3 = pIVar9->Time;
    (pIVar9->TablesLastTimeActive).Data[iVar20] = (float)dVar3;
    pIVar6[lVar18 + -1].LastTimeActive = (float)dVar3;
    table->MemoryCompacted = false;
    pIVar28 = (table->Columns).Data;
    iVar20 = (int)((long)(table->Columns).DataEnd - (long)pIVar28 >> 3) * -0x3b13b13b;
    if (iVar20 == columns_count || iVar20 == 0) {
      local_110 = (void *)0x0;
      pIVar28 = (ImGuiTableColumn *)0x0;
    }
    else {
      local_110 = table->RawData;
      table->RawData = (void *)0x0;
    }
    if (table->RawData == (void *)0x0) {
      TableBeginInitMemory(table,columns_count);
      table->IsSettingsRequestLoad = true;
      table->IsInitializing = true;
    }
    if (table->IsResetAllRequest == true) {
      table->IsInitializing = true;
      table->IsResetAllRequest = false;
      table->IsSettingsRequestLoad = false;
      table->IsSettingsDirty = true;
      table->SettingsLoadedFlags = 0;
    }
    if (table->IsInitializing == true) {
      table->SettingsOffset = -1;
      table->IsSortSpecsDirty = true;
      table->InstanceInteracted = -1;
      table->ContextPopupColumn = -1;
      table->ReorderColumn = -1;
      table->HoveredColumnBody = -1;
      table->HoveredColumnBorder = -1;
      table->AutoFitSingleColumn = -1;
      table->ResizedColumn = -1;
      table->LastResizedColumn = -1;
      if (0 < columns_count) {
        lVar18 = 0x61;
        uVar25 = 0;
        do {
          pIVar8 = (table->Columns).Data;
          puVar15 = (undefined8 *)((long)pIVar8 + lVar18 + -0x61);
          if ((pIVar28 == (ImGuiTableColumn *)0x0) || ((long)iVar20 <= (long)uVar25)) {
            uVar2 = *(undefined4 *)((long)pIVar8 + lVar18 + -0x4d);
            local_78 = 0;
            local_98._Channels.Data = (ImDrawChannel *)0x0;
            uStack_80 = 0;
            uStack_7d = 0;
            local_98._Current = 0;
            local_98._Count = 0;
            local_98._Channels.Size = 0;
            local_98._Channels.Capacity = 0;
            local_a8.x = 0.0;
            local_a8.y = 0.0;
            uStack_a0 = 0;
            uStack_70 = 0xffffff;
            uStack_74 = 0xffffffff;
            *puVar15 = 0;
            *(undefined8 *)((long)pIVar8 + lVar18 + -0x59) = 0;
            *(undefined8 *)((long)pIVar8 + lVar18 + -0x51) = 0xbf800000;
            *(undefined4 *)((long)pIVar8 + lVar18 + -0x49) = 0xbf800000;
            puVar15 = (undefined8 *)((long)pIVar8 + lVar18 + -0x45);
            *puVar15 = 0;
            puVar15[1] = 0;
            puVar15 = (undefined8 *)((long)pIVar8 + lVar18 + -0x35);
            *puVar15 = 0;
            puVar15[1] = 0;
            puVar15 = (undefined8 *)((long)pIVar8 + lVar18 + -0x25);
            *puVar15 = 0;
            puVar15[1] = 0;
            puVar15 = (undefined8 *)((long)pIVar8 + lVar18 + -0x1a);
            *puVar15 = 0;
            puVar15[1] = 0xffffffffffffff00;
            *(undefined8 *)((long)pIVar8 + lVar18 + -7) = 0;
            *(undefined8 *)((long)pIVar8 + lVar18 + -2) = 0;
            *(undefined4 *)((long)pIVar8 + lVar18 + -0x4d) = uVar2;
            *(undefined1 *)((long)&pIVar8->Flags + lVar18) = 1;
            *(undefined2 *)((long)pIVar8 + lVar18 + -6) = 0x101;
            *(undefined4 *)((long)pIVar8 + lVar18 + -10) = 0x1ffffff;
          }
          else {
            puVar22 = (undefined4 *)((long)pIVar28 + lVar18 + -0x61);
            for (lVar24 = 0x19; lVar24 != 0; lVar24 = lVar24 + -1) {
              *(undefined4 *)puVar15 = *puVar22;
              puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
              puVar15 = (undefined8 *)((long)puVar15 + (ulong)bVar29 * -8 + 4);
            }
            *(undefined1 *)((long)&pIVar8->WidthGiven + lVar18 + 1) =
                 *(undefined1 *)((long)&pIVar28->WidthGiven + lVar18 + 1);
            *(undefined2 *)((long)&pIVar8->Flags + lVar18 + 3) =
                 *(undefined2 *)((long)&pIVar28->Flags + lVar18 + 3);
          }
          (table->DisplayOrderToIndex).Data[uVar25] = (char)uVar25;
          *(char *)((long)pIVar8 + lVar18 + -0xf) = (char)uVar25;
          uVar25 = uVar25 + 1;
          lVar18 = lVar18 + 0x68;
        } while ((uint)columns_count != uVar25);
      }
    }
    if (local_110 != (void *)0x0) {
      MemFree(local_110);
    }
    if (table->IsSettingsRequestLoad == true) {
      TableLoadSettings(table);
    }
    fVar36 = pIVar9->FontSize;
    fVar32 = table->RefScale;
    if ((fVar32 != 0.0) || (NAN(fVar32))) {
      if (((fVar32 != fVar36) || (NAN(fVar32) || NAN(fVar36))) && (0 < columns_count)) {
        pIVar28 = (table->Columns).Data;
        lVar18 = 0;
        do {
          *(float *)((long)&pIVar28->WidthRequest + lVar18) =
               *(float *)((long)&pIVar28->WidthRequest + lVar18) * (fVar36 / fVar32);
          lVar18 = lVar18 + 0x68;
        } while ((ulong)(uint)columns_count * 0x68 - lVar18 != 0);
      }
    }
    table->RefScale = fVar36;
    local_d8->SkipItems = true;
    if (0 < (table->ColumnsNames).Buf.Size) {
      iVar20 = (table->ColumnsNames).Buf.Capacity;
      if (iVar20 < 0) {
        uVar16 = iVar20 / 2 + iVar20;
        size = 0;
        if (0 < (int)uVar16) {
          size = (size_t)uVar16;
        }
        __dest_01 = (char *)MemAlloc(size);
        __src_00 = (table->ColumnsNames).Buf.Data;
        if (__src_00 != (char *)0x0) {
          memcpy(__dest_01,__src_00,(long)(table->ColumnsNames).Buf.Size);
          MemFree((table->ColumnsNames).Buf.Data);
        }
        (table->ColumnsNames).Buf.Data = __dest_01;
        (table->ColumnsNames).Buf.Capacity = (int)size;
      }
      (table->ColumnsNames).Buf.Size = 0;
    }
    TableBeginApplyRequests(table);
    bVar10 = true;
  }
  else {
LAB_0015126d:
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}